

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateVertexIdAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  bool bVar1;
  spv_const_context psVar2;
  DiagnosticStream *this_00;
  DiagnosticStream local_200;
  Instruction *local_28;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  local_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar2 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar2->target_env);
  if (bVar1) {
    ValidationState_t::diag(&local_200,this->_,SPV_ERROR_INVALID_DATA,local_28);
    this_00 = DiagnosticStream::operator<<
                        (&local_200,
                         (char (*) [55])"Vulkan spec doesn\'t allow BuiltIn VertexId to be used.");
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this_00);
    DiagnosticStream::~DiagnosticStream(&local_200);
  }
  else {
    this_local._4_4_ = SPV_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateVertexIdAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  (void)decoration;
  if (spvIsVulkanEnv(_.context()->target_env)) {
    return _.diag(SPV_ERROR_INVALID_DATA, &inst)
           << "Vulkan spec doesn't allow BuiltIn VertexId "
              "to be used.";
  }

  return SPV_SUCCESS;
}